

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  char cVar7;
  char *pcVar8;
  buffer_appender<char> bVar9;
  uint uVar10;
  ulong uVar11;
  buffer<char> *buf;
  uint uVar12;
  uint uVar13;
  _Alloc_hider _Var14;
  uint uVar15;
  _Alloc_hider _Var16;
  ulong uVar17;
  int iVar18;
  size_type sVar19;
  uint uVar20;
  uint uVar21;
  ulong size;
  int iVar22;
  string groups;
  char digits [40];
  string local_2a8;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_288;
  char *local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a8,(locale_ref)(this->locale).locale_);
  if (local_2a8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar7 != '\0') {
      uVar15 = this->abs_value;
      uVar13 = 0x1f;
      if ((uVar15 | 1) != 0) {
        for (; (uVar15 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar13 * 2);
      uVar21 = (uint)uVar4 -
               (uint)(uVar15 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)uVar4 * 4));
      iVar22 = -(uint)(uVar15 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                         (ulong)uVar4 * 4));
      pcVar8 = local_2a8._M_dataplus._M_p + local_2a8._M_string_length;
      _Var14._M_p = local_2a8._M_dataplus._M_p;
      uVar13 = uVar21;
      uVar10 = uVar21;
      if (local_2a8._M_string_length != 0) {
        _Var16._M_p = local_2a8._M_dataplus._M_p;
        sVar19 = local_2a8._M_string_length;
        uVar12 = uVar21;
        do {
          cVar2 = *_Var16._M_p;
          uVar20 = uVar10 - (int)cVar2;
          _Var14._M_p = _Var16._M_p;
          uVar13 = uVar12;
          if ((uVar20 == 0 || (int)uVar10 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar12 = uVar12 + 1;
          _Var16._M_p = _Var16._M_p + 1;
          sVar19 = sVar19 - 1;
          _Var14._M_p = pcVar8;
          uVar13 = (int)local_2a8._M_string_length + iVar22 + (uint)uVar4;
          uVar10 = uVar20;
        } while (sVar19 != 0);
      }
      if (_Var14._M_p == pcVar8) {
        uVar13 = uVar13 + (int)(uVar10 - 1) / (int)pcVar8[-1];
      }
      pcVar8 = local_278 + (int)uVar21;
      uVar10 = uVar15;
      if (99 < uVar15) {
        do {
          uVar15 = uVar10 / 100;
          *(undefined2 *)(pcVar8 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar10 % 100) * 2);
          pcVar8 = pcVar8 + -2;
          bVar6 = 9999 < uVar10;
          uVar10 = uVar10 / 100;
        } while (bVar6);
      }
      if (uVar15 < 10) {
        pcVar8[-1] = (byte)uVar15 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar8 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar15 * 2)
        ;
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_007fca68;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar13 = uVar13 + this->prefix_size;
      if (-1 < (int)uVar13) {
        size = (ulong)uVar13;
        if (500 < uVar13) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
        }
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (size <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = size;
        }
        pcVar8 = local_248.super_buffer<char>.ptr_ + (size - 1);
        if (1 < (int)uVar21) {
          uVar17 = (ulong)uVar21;
          iVar18 = iVar22 + (uint)uVar4 + 1;
          iVar22 = 0;
          _Var14._M_p = local_2a8._M_dataplus._M_p;
          do {
            uVar17 = uVar17 - 1;
            pcVar1 = pcVar8 + -1;
            *pcVar8 = local_278[uVar17 & 0xffffffff];
            cVar2 = *_Var14._M_p;
            if (0 < cVar2) {
              iVar22 = iVar22 + 1;
              if ((cVar2 != '\x7f') && (iVar22 % (int)cVar2 == 0)) {
                if (_Var14._M_p + 1 != local_2a8._M_dataplus._M_p + local_2a8._M_string_length) {
                  iVar22 = 0;
                  _Var14._M_p = _Var14._M_p + 1;
                }
                pcVar8[-1] = cVar7;
                pcVar1 = pcVar8 + -2;
              }
            }
            pcVar8 = pcVar1;
            iVar18 = iVar18 + -1;
          } while (2 < iVar18);
        }
        *pcVar8 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar8[-1] = '-';
        }
        pbVar5 = this->specs;
        uVar17 = (ulong)pbVar5->width;
        if (-1 < (long)uVar17) {
          local_280 = local_248.super_buffer<char>.ptr_;
          uVar11 = 0;
          if (size <= uVar17) {
            uVar11 = uVar17 - size;
          }
          bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          local_288 = this;
          if (*(ulong *)((long)bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + size + (pbVar5->fill).size_ * uVar11) {
            (*(code *)**(undefined8 **)
                        bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar17 = uVar11 >> (bVar3 & 0x3f);
          bVar9 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar9,uVar17,&pbVar5->fill);
          bVar9 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                            (local_280,local_280 + size,bVar9);
          bVar9 = fill<fmt::v7::detail::buffer_appender<char>,char>
                            (bVar9,uVar11 - uVar17,&pbVar5->fill);
          (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar9.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_
                           );
          }
          goto LAB_004e6d10;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_004e6d10:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }